

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

int AF_AActor_A_FreezeDeath
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  ulong uVar2;
  player_t *ppVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  PClass *pPVar8;
  AActor *ent;
  char *__assertion;
  bool bVar9;
  FSoundID local_24;
  PClass *pPVar7;
  undefined4 extraout_var_00;
  
  pPVar8 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004b1d00;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    ent = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (ent != (AActor *)0x0) {
        pPVar7 = (ent->super_DThinker).super_DObject.Class;
        if (pPVar7 == (PClass *)0x0) {
          iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
          pPVar7 = (PClass *)CONCAT44(extraout_var,iVar4);
          (ent->super_DThinker).super_DObject.Class = pPVar7;
        }
        bVar9 = pPVar7 != (PClass *)0x0;
        if (pPVar7 != pPVar8 && bVar9) {
          do {
            pPVar7 = pPVar7->ParentClass;
            bVar9 = pPVar7 != (PClass *)0x0;
            if (pPVar7 == pPVar8) break;
          } while (pPVar7 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_004b1d00;
        }
        goto LAB_004b1b8c;
      }
    }
    else if (ent != (AActor *)0x0) goto LAB_004b1cf0;
    ent = (AActor *)0x0;
LAB_004b1b8c:
    uVar5 = FRandom::GenRand32(&pr_freezedeath);
    uVar6 = FRandom::GenRand32(&pr_freezedeath);
    ent->tics = (uVar6 & 0xff) + (uVar5 & 0xff) + 0x4b;
    uVar2._0_4_ = ent->flags;
    uVar2._4_4_ = ent->flags2;
    ent->flags = (ActorFlags)(int)(uVar2 | 0x4160080080006);
    ent->flags2 = (ActorFlags2)(int)((uVar2 | 0x4160080080006) >> 0x20);
    pbVar1 = (byte *)((long)&(ent->flags3).Value + 2);
    *pbVar1 = *pbVar1 | 0x20;
    pPVar8 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar8 == (PClass *)0x0) {
      iVar4 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar8 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (ent->super_DThinker).super_DObject.Class = pPVar8;
    }
    ent->Height = *(double *)(pPVar8->Defaults + 0x180);
    if (((ent->RenderStyle).field_0.BlendOp & 0xfc) == 4) {
      ent->RenderStyle = LegacyRenderStyles[1];
    }
    S_FindSound("misc/freeze");
    S_Sound(ent,4,&local_24,1.0,1.0);
    if (((ent->flags).Value & 0x40000000) != 0) {
      ent->Alpha = 1.0;
      ent->visdir = '\0';
    }
    ppVar3 = ent->player;
    if (ppVar3 == (player_t *)0x0) {
      if ((((ent->flags3).Value & 0x2000) != 0) && (ent->special != 0)) {
        P_ExecuteSpecial(ent->special,(line_t *)0x0,ent,false,ent->args[0],ent->args[1],ent->args[2]
                         ,ent->args[3],ent->args[4]);
        ent->special = 0;
      }
    }
    else {
      ppVar3->damagecount = 0;
      ppVar3->bonuscount = 0;
      ppVar3->poisoncount = 0;
    }
    return 0;
  }
LAB_004b1cf0:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004b1d00:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x55,
                "int AF_AActor_A_FreezeDeath(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FreezeDeath)
{
	PARAM_SELF_PROLOGUE(AActor);

	int t = pr_freezedeath();
	self->tics = 75+t+pr_freezedeath();
	self->flags |= MF_SOLID|MF_SHOOTABLE|MF_NOBLOOD|MF_ICECORPSE;
	self->flags2 |= MF2_PUSHABLE|MF2_TELESTOMP|MF2_PASSMOBJ|MF2_SLIDE;
	self->flags3 |= MF3_CRASHED;
	self->Height = self->GetDefault()->Height;
	// Remove fuzz effects from frozen actors.
	if (self->RenderStyle.BlendOp >= STYLEOP_Fuzz && self->RenderStyle.BlendOp <= STYLEOP_FuzzOrRevSub)
	{
		self->RenderStyle = STYLE_Normal;
	}

	S_Sound (self, CHAN_BODY, "misc/freeze", 1, ATTN_NORM);

	// [RH] Andy Baker's stealth monsters
	if (self->flags & MF_STEALTH)
	{
		self->Alpha = 1;
		self->visdir = 0;
	}

	if (self->player)
	{
		self->player->damagecount = 0;
		self->player->poisoncount = 0;
		self->player->bonuscount = 0;
	}
	else if (self->flags3 & MF3_ISMONSTER && self->special)
	{ // Initiate monster death actions
		P_ExecuteSpecial(self->special, NULL, self, false, self->args[0],
			self->args[1], self->args[2], self->args[3], self->args[4]);
		self->special = 0;
	}
	return 0;
}